

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeTranslator.h
# Opt level: O0

uint8_t * __thiscall
arangodb::velocypack::AttributeTranslator::translate(AttributeTranslator *this,uint64_t id)

{
  bool bVar1;
  reference pvVar2;
  unordered_map<unsigned_long,_const_unsigned_char_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_unsigned_char_*>_>_>
  *in_RDI;
  const_iterator it;
  _Node_iterator_base<std::pair<const_unsigned_long,_const_unsigned_char_*>,_false> local_28;
  _Node_iterator_base<std::pair<const_unsigned_long,_const_unsigned_char_*>,_false> local_20 [3];
  uchar *local_8;
  
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_const_unsigned_char_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_unsigned_char_*>_>_>
       ::find(in_RDI,(key_type *)0x137f25);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_const_unsigned_char_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_unsigned_char_*>_>_>
       ::end(in_RDI);
  bVar1 = std::__detail::operator==(local_20,&local_28);
  if (bVar1) {
    local_8 = (uchar *)0x0;
  }
  else {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_long,_const_unsigned_char_*>,_false,_false>
             ::operator*((_Node_const_iterator<std::pair<const_unsigned_long,_const_unsigned_char_*>,_false,_false>
                          *)0x137f72);
    local_8 = pvVar2->second;
  }
  return local_8;
}

Assistant:

uint8_t const* translate(uint64_t id) const noexcept {
    auto it = _idToKey.find(id);

    if (it == _idToKey.end()) {
      return nullptr;
    }

    return (*it).second;
  }